

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  undefined1 auVar1 [16];
  float fVar2;
  long lVar3;
  Float FVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001384 [12];
  anon_class_8_1_8991fb9c getMaxDensity;
  Bounds3f bounds;
  Tuple3<pbrt::Point3,_float> local_a0;
  Tuple3<pbrt::Point3,_float> local_90;
  anon_class_8_1_8991fb9c local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Bounds3<float> local_48;
  
  (res->super_Tuple3<pbrt::Point3,_int>).x = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 0x10;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->nStored = 0;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
            (__return_storage_ptr__,0x1000);
  lVar3 = 0;
  fVar2 = 0.0;
  local_80.this = this;
  while (fVar6 = fVar2, fVar6 < (float)(res->super_Tuple3<pbrt::Point3,_int>).z) {
    local_78._0_4_ = 0.0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    while (fVar2 = fVar6 + 1.0,
          (float)local_78._0_4_ < (float)(res->super_Tuple3<pbrt::Point3,_int>).y) {
      lVar3 = (long)(int)lVar3;
      local_68 = ZEXT816(0);
      auVar5 = ZEXT416((uint)((float)local_78._0_4_ + 1.0));
      local_58 = (float)local_78._0_4_;
      uStack_54 = local_78._4_4_;
      uStack_50 = local_78._8_4_;
      uStack_4c = local_78._12_4_;
      while( true ) {
        local_78 = auVar5;
        auVar5._0_4_ = (float)(res->super_Tuple3<pbrt::Point3,_int>).x;
        auVar5._4_12_ = in_register_00001384;
        if (auVar5._0_4_ <= local_68._0_4_) break;
        auVar7._0_4_ = (float)(res->super_Tuple3<pbrt::Point3,_int>).y;
        auVar7._4_12_ = in_register_00001384;
        local_a0.z = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
        auVar1 = vinsertps_avx(local_68,ZEXT416((uint)local_58),0x10);
        auVar7 = vinsertps_avx(auVar5,auVar7,0x10);
        local_90.z = fVar6 / local_a0.z;
        local_68 = ZEXT416((uint)(local_68._0_4_ + 1.0));
        auVar5 = vdivps_avx(auVar1,auVar7);
        local_90._0_8_ = vmovlps_avx(auVar5);
        auVar5 = vinsertps_avx(local_68,ZEXT416((uint)local_78._0_4_),0x10);
        auVar5 = vdivps_avx(auVar5,auVar7);
        local_a0.z = (fVar6 + 1.0) / local_a0.z;
        local_a0._0_8_ = vmovlps_avx(auVar5);
        Bounds3<float>::Bounds3(&local_48,(Point3<float> *)&local_90,(Point3<float> *)&local_a0);
        FVar4 = GetMaxDensityGrid::anon_class_8_1_8991fb9c::operator()(&local_80,&local_48);
        __return_storage_ptr__->ptr[lVar3] = FVar4;
        lVar3 = lVar3 + 1;
        auVar5 = local_78;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(16, 16, 16);
        pstd::vector<Float> maxGrid(alloc);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaxValue(bounds);
            else
                return rgbDensityGrid->MaxValue(
                    bounds,
                    [] PBRT_CPU_GPU(RGBUnboundedSpectrum s) { return s.MaxValue(); });
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (Float z = 0; z < res->z; ++z)
            for (Float y = 0; y < res->y; ++y)
                for (Float x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(x / res->x, y / res->y, z / res->z),
                        Point3f((x + 1) / res->x, (y + 1) / res->y, (z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }